

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unzip.c
# Opt level: O2

int unzCloseCurrentFile(unzFile file)

{
  undefined8 *__ptr;
  int iVar1;
  
  iVar1 = -0x66;
  if ((file != (unzFile)0x0) &&
     (__ptr = *(undefined8 **)((long)file + 0x140), __ptr != (undefined8 *)0x0)) {
    iVar1 = 0;
    if ((__ptr[0x18] == 0) && (*(int *)(__ptr + 0x27) == 0)) {
      iVar1 = -0x69;
      if (__ptr[0x15] == __ptr[0x16]) {
        iVar1 = 0;
      }
    }
    free((void *)*__ptr);
    *__ptr = 0;
    if (__ptr[0x10] == 8) {
      inflateEnd(__ptr + 1);
    }
    free(__ptr);
    *(undefined8 *)((long)file + 0x140) = 0;
  }
  return iVar1;
}

Assistant:

extern int ZEXPORT unzCloseCurrentFile(unzFile file)
{
    int err = UNZ_OK;

    unz64_s* s;
    file_in_zip64_read_info_s* pfile_in_zip_read_info;
    if (file == NULL)
        return UNZ_PARAMERROR;
    s = (unz64_s*)file;
    pfile_in_zip_read_info = s->pfile_in_zip_read;

    if (pfile_in_zip_read_info == NULL)
        return UNZ_PARAMERROR;


    if ((pfile_in_zip_read_info->rest_read_uncompressed == 0) &&
        (!pfile_in_zip_read_info->raw))
    {
        if (pfile_in_zip_read_info->crc32 != pfile_in_zip_read_info->crc32_wait)
            err = UNZ_CRCERROR;
    }


    TRYFREE(pfile_in_zip_read_info->read_buffer);
    pfile_in_zip_read_info->read_buffer = NULL;
    if (pfile_in_zip_read_info->stream_initialised == Z_DEFLATED)
        inflateEnd(&pfile_in_zip_read_info->stream);
#ifdef HAVE_BZIP2
    else if (pfile_in_zip_read_info->stream_initialised == Z_BZIP2ED)
        BZ2_bzDecompressEnd(&pfile_in_zip_read_info->bstream);
#endif


    pfile_in_zip_read_info->stream_initialised = 0;
    TRYFREE(pfile_in_zip_read_info);

    s->pfile_in_zip_read = NULL;

    return err;
}